

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFContext.cpp
# Opt level: O2

void __thiscall
llvm::DWARFContext::addLocalsForDie
          (DWARFContext *this,DWARFCompileUnit *CU,DWARFDie Subprogram,DWARFDie Die,
          vector<llvm::DILocal,_std::allocator<llvm::DILocal>_> *Result)

{
  uint64_t FileIndex;
  byte bVar1;
  Tag TVar2;
  DWARFFormValue *pDVar3;
  ArrayRef<unsigned_char> *pAVar4;
  uchar *puVar5;
  LineTable *this_00;
  unsigned_long *puVar6;
  char *Str;
  Optional<const_char_*> OVar7;
  Optional<unsigned_long> OVar8;
  DWARFDie DVar9;
  DWARFDie DVar10;
  undefined1 local_158 [8];
  iterator __begin1;
  _Alloc_hider local_138;
  size_type local_130;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_128;
  string local_118;
  unsigned_long local_f8;
  anon_union_8_2_fc7899a5_for_OptionalStorage<long,_true>_2 local_f0;
  bool local_e8;
  anon_union_8_2_fc7899a5_for_OptionalStorage<unsigned_long,_true>_2 local_e0;
  bool local_d8;
  anon_union_8_2_fc7899a5_for_OptionalStorage<unsigned_long,_true>_2 local_d0;
  bool local_c8;
  StringRef local_c0;
  undefined1 local_b0 [8];
  Optional<llvm::DWARFFormValue> NameAttr;
  DWARFDie local_70;
  DWARFUnit *local_60;
  undefined1 local_58 [8];
  Optional<const_char_*> Name;
  DWARFDie local_40;
  
  NameAttr.Storage._48_8_ = this;
  local_70 = Subprogram;
  local_60 = &CU->super_DWARFUnit;
  local_40 = Die;
  TVar2 = DWARFDie::getTag(&local_40);
  if ((TVar2 == DW_TAG_variable) ||
     (TVar2 = DWARFDie::getTag(&local_40), TVar2 == DW_TAG_formal_parameter)) {
    __begin1.Die.U = (DWARFUnit *)0x0;
    local_158 = (undefined1  [8])&__begin1.Die.Die;
    __begin1.Die.Die._0_1_ = 0;
    local_138._M_p = (pointer)&local_128;
    local_130 = 0;
    local_128._M_local_buf[0] = '\0';
    local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
    local_118._M_string_length = 0;
    local_118.field_2._M_local_buf[0] = '\0';
    local_f8 = 0;
    local_f0.value = local_f0.value & 0xffffffffffffff00;
    local_e8 = false;
    local_e0.value = local_e0.value & 0xffffffffffffff00;
    local_d8 = false;
    local_d0.value = local_d0.value & 0xffffffffffffff00;
    local_c8 = false;
    DWARFDie::find((Optional<llvm::DWARFFormValue> *)local_b0,&local_70,DW_AT_name);
    if (NameAttr.Storage.field_0._40_1_ == '\x01') {
      pDVar3 = optional_detail::OptionalStorage<llvm::DWARFFormValue,_true>::getValue
                         ((OptionalStorage<llvm::DWARFFormValue,_true> *)local_b0);
      OVar7 = DWARFFormValue::getAsCString(pDVar3);
      local_58 = (undefined1  [8])OVar7.Storage.field_0;
      Name.Storage.field_0.empty = OVar7.Storage.hasVal;
      if (((undefined1  [16])OVar7.Storage & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        optional_detail::OptionalStorage<const_char_*,_true>::getValue
                  ((OptionalStorage<const_char_*,_true> *)local_58);
        std::__cxx11::string::assign(local_158);
      }
    }
    DWARFDie::find((Optional<llvm::DWARFFormValue> *)local_b0,&local_40,DW_AT_location);
    if (NameAttr.Storage.field_0._40_1_ == '\x01') {
      pDVar3 = optional_detail::OptionalStorage<llvm::DWARFFormValue,_true>::getValue
                         ((OptionalStorage<llvm::DWARFFormValue,_true> *)local_b0);
      DWARFFormValue::getAsBlock((Optional<llvm::ArrayRef<unsigned_char>_> *)local_58,pDVar3);
      if ((Name.Storage.hasVal == true) &&
         (pAVar4 = optional_detail::OptionalStorage<llvm::ArrayRef<unsigned_char>,_true>::getValue
                             ((OptionalStorage<llvm::ArrayRef<unsigned_char>,_true> *)local_58),
         pAVar4->Length != 0)) {
        pAVar4 = optional_detail::OptionalStorage<llvm::ArrayRef<unsigned_char>,_true>::getValue
                           ((OptionalStorage<llvm::ArrayRef<unsigned_char>,_true> *)local_58);
        puVar5 = ArrayRef<unsigned_char>::operator[](pAVar4,0);
        if (*puVar5 == 0x91) {
          pAVar4 = optional_detail::OptionalStorage<llvm::ArrayRef<unsigned_char>,_true>::getValue
                             ((OptionalStorage<llvm::ArrayRef<unsigned_char>,_true> *)local_58);
          puVar5 = pAVar4->Data;
          pAVar4 = optional_detail::OptionalStorage<llvm::ArrayRef<unsigned_char>,_true>::getValue
                             ((OptionalStorage<llvm::ArrayRef<unsigned_char>,_true> *)local_58);
          local_f0.value =
               decodeSLEB128(puVar5 + 1,(uint *)0x0,pAVar4->Data + pAVar4->Length,(char **)0x0);
          if (local_e8 == false) {
            local_e8 = true;
          }
        }
      }
    }
    DWARFDie::find((Optional<llvm::DWARFFormValue> *)local_b0,&local_40,DW_AT_LLVM_tag_offset);
    if (NameAttr.Storage.field_0._40_1_ == '\x01') {
      pDVar3 = optional_detail::OptionalStorage<llvm::DWARFFormValue,_true>::getValue
                         ((OptionalStorage<llvm::DWARFFormValue,_true> *)local_b0);
      OVar8 = DWARFFormValue::getAsUnsignedConstant(pDVar3);
      local_d0 = OVar8.Storage.field_0;
      local_c8 = OVar8.Storage.hasVal;
    }
    DVar9 = DWARFDie::getAttributeValueAsReferencedDie(&local_40,DW_AT_abstract_origin);
    if (DVar9.Die != (DWARFDebugInfoEntry *)0x0 && DVar9.U != (DWARFUnit *)0x0) {
      local_40 = DVar9;
    }
    DWARFDie::find((Optional<llvm::DWARFFormValue> *)local_b0,&local_40,DW_AT_name);
    if (NameAttr.Storage.field_0._40_1_ == '\x01') {
      pDVar3 = optional_detail::OptionalStorage<llvm::DWARFFormValue,_true>::getValue
                         ((OptionalStorage<llvm::DWARFFormValue,_true> *)local_b0);
      OVar7 = DWARFFormValue::getAsCString(pDVar3);
      local_58 = (undefined1  [8])OVar7.Storage.field_0;
      Name.Storage.field_0.empty = OVar7.Storage.hasVal;
      if (((undefined1  [16])OVar7.Storage & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        optional_detail::OptionalStorage<const_char_*,_true>::getValue
                  ((OptionalStorage<const_char_*,_true> *)local_58);
        std::__cxx11::string::assign((char *)&local_138);
      }
    }
    DVar9 = DWARFDie::getAttributeValueAsReferencedDie(&local_40,DW_AT_type);
    if (DVar9.Die != (DWARFDebugInfoEntry *)0x0 && DVar9.U != (DWARFUnit *)0x0) {
      bVar1 = getCUAddrSize((DWARFContext *)NameAttr.Storage._48_8_);
      OVar8 = getTypeSize(DVar9,(ulong)bVar1);
      local_e0 = OVar8.Storage.field_0;
      local_d8 = OVar8.Storage.hasVal;
    }
    DWARFDie::find((Optional<llvm::DWARFFormValue> *)local_b0,&local_40,DW_AT_decl_file);
    if ((NameAttr.Storage.field_0._40_1_ == '\x01') &&
       (this_00 = getLineTableForUnit(local_60->Context,local_60), this_00 != (LineTable *)0x0)) {
      pDVar3 = optional_detail::OptionalStorage<llvm::DWARFFormValue,_true>::getValue
                         ((OptionalStorage<llvm::DWARFFormValue,_true> *)local_b0);
      OVar8 = DWARFFormValue::getAsUnsignedConstant(pDVar3);
      local_58 = (undefined1  [8])OVar8.Storage.field_0;
      Name.Storage.field_0.empty = OVar8.Storage.hasVal;
      puVar6 = optional_detail::OptionalStorage<unsigned_long,_true>::getValue
                         ((OptionalStorage<unsigned_long,_true> *)local_58);
      FileIndex = *puVar6;
      Str = DWARFUnit::getCompilationDir(local_60);
      StringRef::StringRef(&local_c0,Str);
      DWARFDebugLine::LineTable::getFileNameByIndex
                (this_00,FileIndex,local_c0,AbsoluteFilePath,&local_118);
    }
    DWARFDie::find((Optional<llvm::DWARFFormValue> *)local_b0,&local_40,DW_AT_decl_line);
    if (NameAttr.Storage.field_0._40_1_ == '\x01') {
      pDVar3 = optional_detail::OptionalStorage<llvm::DWARFFormValue,_true>::getValue
                         ((OptionalStorage<llvm::DWARFFormValue,_true> *)local_b0);
      OVar8 = DWARFFormValue::getAsUnsignedConstant(pDVar3);
      local_58 = (undefined1  [8])OVar8.Storage.field_0;
      Name.Storage.field_0.empty = OVar8.Storage.hasVal;
      puVar6 = optional_detail::OptionalStorage<unsigned_long,_true>::getValue
                         ((OptionalStorage<unsigned_long,_true> *)local_58);
      local_f8 = *puVar6;
    }
    std::vector<llvm::DILocal,_std::allocator<llvm::DILocal>_>::push_back
              (Result,(value_type *)local_158);
    DILocal::~DILocal((DILocal *)local_158);
  }
  else {
    TVar2 = DWARFDie::getTag(&local_40);
    if ((TVar2 == DW_TAG_inlined_subroutine) &&
       (DVar9 = DWARFDie::getAttributeValueAsReferencedDie(&local_40,DW_AT_abstract_origin),
       DVar9.Die != (DWARFDebugInfoEntry *)0x0 && DVar9.U != (DWARFUnit *)0x0)) {
      local_70 = DVar9;
    }
    DVar9 = DWARFDie::getFirstChild(&local_40);
    _local_158 = DVar9;
    DVar10 = DWARFDie::getLastChild(&local_40);
    while (SUB168((undefined1  [16])DVar10 ^ (undefined1  [16])DVar9,0) != 0 ||
           SUB168((undefined1  [16])DVar10 ^ (undefined1  [16])DVar9,8) != 0) {
      addLocalsForDie((DWARFContext *)NameAttr.Storage._48_8_,(DWARFCompileUnit *)local_60,local_70,
                      DVar9,Result);
      DWARFDie::iterator::operator++((iterator *)local_158);
      DVar9 = _local_158;
    }
  }
  return;
}

Assistant:

void DWARFContext::addLocalsForDie(DWARFCompileUnit *CU, DWARFDie Subprogram,
                                   DWARFDie Die, std::vector<DILocal> &Result) {
  if (Die.getTag() == DW_TAG_variable ||
      Die.getTag() == DW_TAG_formal_parameter) {
    DILocal Local;
    if (auto NameAttr = Subprogram.find(DW_AT_name))
      if (Optional<const char *> Name = NameAttr->getAsCString())
        Local.FunctionName = *Name;
    if (auto LocationAttr = Die.find(DW_AT_location))
      if (Optional<ArrayRef<uint8_t>> Location = LocationAttr->getAsBlock())
        if (!Location->empty() && (*Location)[0] == DW_OP_fbreg)
          Local.FrameOffset =
              decodeSLEB128(Location->data() + 1, nullptr, Location->end());
    if (auto TagOffsetAttr = Die.find(DW_AT_LLVM_tag_offset))
      Local.TagOffset = TagOffsetAttr->getAsUnsignedConstant();

    if (auto Origin =
            Die.getAttributeValueAsReferencedDie(DW_AT_abstract_origin))
      Die = Origin;
    if (auto NameAttr = Die.find(DW_AT_name))
      if (Optional<const char *> Name = NameAttr->getAsCString())
        Local.Name = *Name;
    if (auto Type = Die.getAttributeValueAsReferencedDie(DW_AT_type))
      Local.Size = getTypeSize(Type, getCUAddrSize());
    if (auto DeclFileAttr = Die.find(DW_AT_decl_file)) {
      if (const auto *LT = CU->getContext().getLineTableForUnit(CU))
        LT->getFileNameByIndex(
            DeclFileAttr->getAsUnsignedConstant().getValue(),
            CU->getCompilationDir(),
            DILineInfoSpecifier::FileLineInfoKind::AbsoluteFilePath,
            Local.DeclFile);
    }
    if (auto DeclLineAttr = Die.find(DW_AT_decl_line))
      Local.DeclLine = DeclLineAttr->getAsUnsignedConstant().getValue();

    Result.push_back(Local);
    return;
  }

  if (Die.getTag() == DW_TAG_inlined_subroutine)
    if (auto Origin =
            Die.getAttributeValueAsReferencedDie(DW_AT_abstract_origin))
      Subprogram = Origin;

  for (auto Child : Die)
    addLocalsForDie(CU, Subprogram, Child, Result);
}